

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_runtime_api.cc
# Opt level: O3

int TVMFuncCreateFromCFunc
              (TVMPackedCFunc func,void *resource_handle,TVMPackedCFuncFinalizer fin,
              TVMFunctionHandle *out)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)> *pfVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<void> rpack;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  if (fin == (TVMPackedCFuncFinalizer)0x0) {
    pfVar2 = (function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)> *)
             operator_new(0x20);
    local_30 = std::
               _Function_handler<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/liueo[P]TVM-deploy/./tvm/src/runtime/c_runtime_api.cc:509:9)>
               ::_M_invoke;
    local_38 = std::
               _Function_handler<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/liueo[P]TVM-deploy/./tvm/src/runtime/c_runtime_api.cc:509:9)>
               ::_M_manager;
    local_48._M_unused._0_8_ = (undefined8)func;
    local_48._8_8_ = resource_handle;
    std::function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)>::function
              (pfVar2,(function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)> *)
                      &local_48);
    *out = pfVar2;
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
  }
  else {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<void*,void(*)(void*),std::allocator<void>,void>(&local_70,resource_handle);
    pfVar2 = (function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)> *)
             operator_new(0x20);
    _Var1._M_pi = local_70._M_pi;
    if (local_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_70._M_pi)->_M_use_count = (local_70._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_70._M_pi)->_M_use_count = (local_70._M_pi)->_M_use_count + 1;
      }
    }
    local_58 = (code *)0x0;
    pcStack_50 = (code *)0x0;
    local_68._M_unused._M_object = (void *)0x0;
    local_68._8_8_ = 0;
    local_68._M_unused._M_object = operator_new(0x18);
    *(TVMPackedCFunc *)local_68._M_unused._0_8_ = func;
    *(void **)((long)local_68._M_unused._0_8_ + 8) = resource_handle;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_68._M_unused._0_8_ + 0x10) =
         _Var1._M_pi;
    pcStack_50 = std::
                 _Function_handler<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/liueo[P]TVM-deploy/./tvm/src/runtime/c_runtime_api.cc:521:9)>
                 ::_M_invoke;
    local_58 = std::
               _Function_handler<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/liueo[P]TVM-deploy/./tvm/src/runtime/c_runtime_api.cc:521:9)>
               ::_M_manager;
    std::function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)>::function
              (pfVar2,(function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)> *)
                      &local_68);
    *out = pfVar2;
    if (local_58 != (code *)0x0) {
      (*local_58)(&local_68,&local_68,__destroy_functor);
    }
    if (local_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70._M_pi);
    }
  }
  return 0;
}

Assistant:

int TVMFuncCreateFromCFunc(TVMPackedCFunc func,
                           void* resource_handle,
                           TVMPackedCFuncFinalizer fin,
                           TVMFunctionHandle *out) {
  API_BEGIN();
  if (fin == nullptr) {
    *out = new PackedFunc(
        [func, resource_handle](TVMArgs args, TVMRetValue* rv) {
          int ret = func((TVMValue*)args.values, (int*)args.type_codes, // NOLINT(*)
                         args.num_args, rv, resource_handle);
          if (ret != 0) {
            throw dmlc::Error(TVMGetLastError() + ::dmlc::StackTrace());
          }
        });
  } else {
    // wrap it in a shared_ptr, with fin as deleter.
    // so fin will be called when the lambda went out of scope.
    std::shared_ptr<void> rpack(resource_handle, fin);
    *out = new PackedFunc(
        [func, rpack](TVMArgs args, TVMRetValue* rv) {
          int ret = func((TVMValue*)args.values, (int*)args.type_codes, // NOLINT(*)
                         args.num_args, rv, rpack.get());
          if (ret != 0) {
            throw dmlc::Error(TVMGetLastError() + ::dmlc::StackTrace());
          }
      });
  }
  API_END();
}